

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::MpRepeatedVarint<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  uint32_t uVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  undefined1 auVar5 [16];
  LogMessageFatal local_a0 [23];
  Voidify local_89;
  int local_88;
  unsigned_short local_82;
  string *local_80;
  string *absl_log_internal_check_op_result;
  ushort local_6c;
  ushort local_6a;
  uint16_t rep;
  MessageLite *pMStack_68;
  uint16_t xform_val;
  MessageLite *local_60;
  uint local_54;
  uint32_t local_50;
  uint32_t decoded_wiretype;
  uint32_t decoded_tag;
  uint16_t type_card;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  
  entry = (FieldEntry *)hasbits;
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  uVar2 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  _decoded_tag = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar2)
  ;
  decoded_wiretype._2_2_ = _decoded_tag->type_card;
  local_50 = TcFieldData::tag((TcFieldData *)&msg_local);
  local_54 = local_50 & 7;
  if (local_54 == 2) {
    local_60 = msg_local;
    pcVar3 = MpPackedVarint<true>
                       ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                        (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
    return pcVar3;
  }
  if (local_54 != 0) {
    pMStack_68 = msg_local;
    pcVar3 = (char *)(**(code **)(hasbits_local + 0x30))
                               (ptr_local,ctx_local,table_local,msg_local,hasbits_local,entry);
    return pcVar3;
  }
  local_6a = decoded_wiretype._2_2_ & 0x600;
  local_6c = decoded_wiretype._2_2_ & 0x1c0;
  uVar1 = local_6c >> 6;
  if (uVar1 == 0) {
    pcVar3 = MpRepeatedVarintT<true,bool,(unsigned_short)0>
                       ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                        (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
    return pcVar3;
  }
  if (uVar1 == 2) {
    switch(local_6a >> 9) {
    case 0:
      pcVar3 = MpRepeatedVarintT<true,unsigned_int,(unsigned_short)0>
                         ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                          (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
      return pcVar3;
    case 1:
      pcVar3 = MpRepeatedVarintT<true,unsigned_int,(unsigned_short)0>
                         ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                          (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
      return pcVar3;
    case 2:
      pcVar3 = MpRepeatedVarintT<true,unsigned_int,(unsigned_short)0>
                         ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                          (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
      return pcVar3;
    case 3:
      pcVar3 = MpRepeatedVarintT<true,unsigned_int,(unsigned_short)0>
                         ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                          (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
      return pcVar3;
    default:
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x7d5);
    }
  }
  if (uVar1 != 3) {
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0x7dc);
  }
  if (local_6a != 0) {
    local_82 = absl::lts_20240722::log_internal::GetReferenceableValue(local_6a);
    local_88 = absl::lts_20240722::log_internal::GetReferenceableValue(0x200);
    local_80 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_short,int>
                         (&local_82,&local_88,"xform_val == +field_layout::kTvZigZag");
    if (local_80 == (string *)0x0) {
      pcVar3 = MpRepeatedVarintT<true,unsigned_long,(unsigned_short)0>
                         ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                          (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
      return pcVar3;
    }
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_80);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x7be,auVar5._0_8_,auVar5._8_8_);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_a0);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_89,pLVar4);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_a0);
  }
  absl_log_internal_check_op_result = (string *)msg_local;
  pcVar3 = MpRepeatedVarintT<true,unsigned_long,(unsigned_short)0>
                     ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                      (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
  return pcVar3;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedVarint(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const auto type_card = entry.type_card;
  const uint32_t decoded_tag = data.tag();
  const auto decoded_wiretype = decoded_tag & 7;

  // Check for packed repeated fallback:
  if (decoded_wiretype == WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpPackedVarint<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  // Check for wire type mismatch:
  if (decoded_wiretype != WireFormatLite::WIRETYPE_VARINT) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  // For split we avoid the duplicate code and have the impl reload the value.
  // Less code bloat for uncommon paths.
  const uint16_t xform_val = (type_card & field_layout::kTvMask);
  const uint16_t rep = type_card & field_layout::kRepMask;
  switch (rep >> field_layout::kRepShift) {
    case field_layout::kRep64Bits >> field_layout::kRepShift:
      if (xform_val == 0) {
        PROTOBUF_MUSTTAIL return MpRepeatedVarintT<is_split, uint64_t, 0>(
            PROTOBUF_TC_PARAM_PASS);
      } else {
        ABSL_DCHECK_EQ(xform_val, +field_layout::kTvZigZag);
        PROTOBUF_MUSTTAIL return MpRepeatedVarintT<
            is_split, uint64_t, (is_split ? 0 : field_layout::kTvZigZag)>(
            PROTOBUF_TC_PARAM_PASS);
      }
    case field_layout::kRep32Bits >> field_layout::kRepShift:
      switch (xform_val >> field_layout::kTvShift) {
        case 0:
          PROTOBUF_MUSTTAIL return MpRepeatedVarintT<is_split, uint32_t, 0>(
              PROTOBUF_TC_PARAM_PASS);
        case field_layout::kTvZigZag >> field_layout::kTvShift:
          PROTOBUF_MUSTTAIL return MpRepeatedVarintT<
              is_split, uint32_t, (is_split ? 0 : field_layout::kTvZigZag)>(
              PROTOBUF_TC_PARAM_PASS);
        case field_layout::kTvEnum >> field_layout::kTvShift:
          PROTOBUF_MUSTTAIL return MpRepeatedVarintT<
              is_split, uint32_t, (is_split ? 0 : field_layout::kTvEnum)>(
              PROTOBUF_TC_PARAM_PASS);
        case field_layout::kTvRange >> field_layout::kTvShift:
          PROTOBUF_MUSTTAIL return MpRepeatedVarintT<
              is_split, uint32_t, (is_split ? 0 : field_layout::kTvRange)>(
              PROTOBUF_TC_PARAM_PASS);
        default:
          Unreachable();
      }
    case field_layout::kRep8Bits >> field_layout::kRepShift:
      PROTOBUF_MUSTTAIL return MpRepeatedVarintT<is_split, bool, 0>(
          PROTOBUF_TC_PARAM_PASS);

    default:
      Unreachable();
      return nullptr;  // To silence -Werror=return-type in some toolchains
  }
}